

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,FILE *fp)

{
  int iVar1;
  size_t __n;
  char *__ptr;
  size_t sVar2;
  XMLError error;
  
  Clear(this);
  fseek((FILE *)fp,0,0);
  iVar1 = fgetc((FILE *)fp);
  if (iVar1 == -1) {
    iVar1 = ferror((FILE *)fp);
    if (iVar1 == 0) goto LAB_00131eb9;
LAB_00131f34:
    error = XML_ERROR_FILE_READ_ERROR;
  }
  else {
LAB_00131eb9:
    fseek((FILE *)fp,0,2);
    __n = ftell((FILE *)fp);
    fseek((FILE *)fp,0,0);
    if (__n != 0) {
      if (__n != 0xffffffffffffffff) {
        __ptr = (char *)operator_new__(__n + 1);
        this->_charBuffer = __ptr;
        sVar2 = fread(__ptr,1,__n,(FILE *)fp);
        if (sVar2 == __n) {
          this->_charBuffer[__n] = '\0';
          Parse(this);
          goto LAB_00131f51;
        }
      }
      goto LAB_00131f34;
    }
    error = XML_ERROR_EMPTY_DOCUMENT;
  }
  SetError(this,error,0,(char *)0x0);
LAB_00131f51:
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::LoadFile(FILE* fp)
{
    Clear();

    fseek(fp, 0, SEEK_SET);
    if (fgetc(fp) == EOF && ferror(fp) != 0) {
        SetError(XML_ERROR_FILE_READ_ERROR, 0, 0);
        return _errorID;
    }

    fseek(fp, 0, SEEK_END);
    const long filelength = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    if (filelength == -1L) {
        SetError(XML_ERROR_FILE_READ_ERROR, 0, 0);
        return _errorID;
    }
    TIXMLASSERT(filelength >= 0);

    if (!LongFitsIntoSizeTMinusOne<>::Fits(filelength)) {
        // Cannot handle files which won't fit in buffer together with null terminator
        SetError(XML_ERROR_FILE_READ_ERROR, 0, 0);
        return _errorID;
    }

    if (filelength == 0) {
        SetError(XML_ERROR_EMPTY_DOCUMENT, 0, 0);
        return _errorID;
    }

    const size_t size = filelength;
    TIXMLASSERT(_charBuffer == 0);
    _charBuffer = new char[size + 1];
    const size_t read = fread(_charBuffer, 1, size, fp);
    if (read != size) {
        SetError(XML_ERROR_FILE_READ_ERROR, 0, 0);
        return _errorID;
    }

    _charBuffer[size] = 0;

    Parse();
    return _errorID;
}